

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void iqxmlrpc::http::validator::expect_continue(string *val)

{
  bool bVar1;
  Expectation_failed *this;
  locale lStack_38;
  string exp;
  
  std::__cxx11::string::string((string *)&exp,(string *)val);
  std::locale::locale(&lStack_38);
  boost::algorithm::to_lower<std::__cxx11::string>(&exp,&lStack_38);
  std::locale::~locale(&lStack_38);
  bVar1 = boost::algorithm::starts_with<std::__cxx11::string,char[13],boost::algorithm::is_equal>
                    (&exp,"100-continue");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&exp);
    return;
  }
  this = (Expectation_failed *)__cxa_allocate_exception(0x50);
  Expectation_failed::Expectation_failed(this);
  __cxa_throw(this,&Expectation_failed::typeinfo,Error_response::~Error_response);
}

Assistant:

void expect_continue(const std::string& val)
{
  std::string exp(val);
  boost::to_lower(exp);

  if (!boost::starts_with(exp, "100-continue"))
    throw Expectation_failed();
}